

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

int32_t upb_Message_GetInt32(upb_Message *msg,upb_MiniTableField *f,int32_t default_val)

{
  upb_CType uVar1;
  upb_FieldRep uVar2;
  bool bVar3;
  upb_MessageValue uVar4;
  int32_t local_40;
  undefined4 uStack_2c;
  upb_MessageValue def;
  int32_t default_val_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  uVar1 = upb_MiniTableField_CType(f);
  bVar3 = true;
  if (uVar1 != kUpb_CType_Int32) {
    uVar1 = upb_MiniTableField_CType(f);
    bVar3 = uVar1 == kUpb_CType_Enum;
  }
  if (!bVar3) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,399,
                  "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  bVar3 = upb_MiniTableField_IsScalar(f);
  if (!bVar3) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,400,
                  "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f);
  if (uVar2 == kUpb_FieldRep_4Byte) {
    uVar4.int64_val._4_4_ = uStack_2c;
    uVar4.int32_val = default_val;
    uVar4.str_val.size = def.int64_val;
    uVar4 = upb_Message_GetField(msg,f,uVar4);
    local_40 = uVar4.int32_val;
    return local_40;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x191,
                "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
               );
}

Assistant:

UPB_API_INLINE int32_t upb_Message_GetInt32(const struct upb_Message* msg,
                                            const upb_MiniTableField* f,
                                            int32_t default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);

  upb_MessageValue def;
  def.int32_val = default_val;
  return upb_Message_GetField(msg, f, def).int32_val;
}